

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRTables.cpp
# Opt level: O2

void init_lr_tables(void)

{
  vector<TableElement,std::allocator<TableElement>> *pvVar1;
  initializer_list<Token> __l;
  allocator_type local_8b;
  allocator local_8a;
  allocator local_89;
  GenExpr local_88;
  undefined1 local_50 [40];
  undefined1 local_28 [16];
  undefined8 local_18;
  
  std::__cxx11::string::string((string *)&local_88,"A",&local_89);
  local_50._0_4_ = ~ERROR;
  std::__cxx11::string::string((string *)(local_50 + 8),"s",&local_8a);
  local_28._0_4_ = 0;
  local_28._4_4_ = 0;
  local_28._8_4_ = 0;
  local_28._12_4_ = 0;
  local_18._0_4_ = 0;
  local_18._4_4_ = 0;
  __l._M_len = 1;
  __l._M_array = (iterator)local_50;
  std::vector<Token,_std::allocator<Token>_>::vector(&local_88.right,__l,&local_8b);
  std::vector<GenExpr,_std::allocator<GenExpr>_>::emplace_back<GenExpr>(&gen_expressions,&local_88);
  GenExpr::~GenExpr(&local_88);
  std::__cxx11::string::~string((string *)(local_50 + 8));
  local_50._0_4_ = SYN_VERTICAL_LINE;
  pvVar1 = (vector<TableElement,std::allocator<TableElement>> *)
           std::
           map<TOKEN_SYN,_std::vector<TableElement,_std::allocator<TableElement>_>,_std::less<TOKEN_SYN>,_std::allocator<std::pair<const_TOKEN_SYN,_std::vector<TableElement,_std::allocator<TableElement>_>_>_>_>
           ::operator[](&action_table,(key_type *)local_50);
  std::vector<TableElement,std::allocator<TableElement>>::_M_assign_aux<TableElement_const*>
            (pvVar1,0,0);
  return;
}

Assistant:

void init_lr_tables(){
    gen_expressions.push_back({"A", {{.token="s"}}});

    action_table[TOKEN_SYN::SYN_VERTICAL_LINE] = {};
}